

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableModel::setItemData(QTableModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  _Rb_tree_color t;
  bool bVar1;
  QTableWidget *this_00;
  QTableWidgetItem *pQVar2;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    this_00 = view(this);
    pQVar2 = item(this,index);
    if (pQVar2 == (QTableWidgetItem *)0x0) {
      if (this_00 == (QTableWidget *)0x0) goto LAB_00535b6d;
      pQVar2 = createItem(this);
      pQVar3 = (roles->d).d.ptr;
      if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var4 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      while( true ) {
        p_Var5 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          p_Var5 = (_Rb_tree_node_base *)0x0;
        }
        if (p_Var4 == p_Var5) break;
        (*pQVar2->_vptr_QTableWidgetItem[4])(pQVar2,(ulong)p_Var4[1]._M_color,&p_Var4[1]._M_parent);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        pQVar3 = (roles->d).d.ptr;
      }
      QTableWidget::setItem(this_00,index->r,index->c,pQVar2);
    }
    else {
      pQVar2->view = (QTableWidget *)0x0;
      local_78.size = 0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (int *)0x0;
      pQVar3 = (roles->d).d.ptr;
      if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var4 = (_Base_ptr)0x0;
      }
      else {
        p_Var4 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      while( true ) {
        p_Var5 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (pQVar3 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          p_Var5 = (_Rb_tree_node_base *)0x0;
        }
        if (p_Var4 == p_Var5) break;
        t = p_Var4[1]._M_color;
        if (p_Var4[1]._M_color == 2) {
          t = _S_red;
        }
        (*pQVar2->_vptr_QTableWidgetItem[3])(&local_58,pQVar2,(ulong)t);
        bVar1 = ::operator!=(&local_58,(QVariant *)&p_Var4[1]._M_parent);
        ::QVariant::~QVariant(&local_58);
        if (bVar1) {
          (*pQVar2->_vptr_QTableWidgetItem[4])(pQVar2,(ulong)t,&p_Var4[1]._M_parent);
          QList<int>::append((QList<int> *)&local_78,t);
          if (t == _S_red) {
            QList<int>::append((QList<int> *)&local_78,2);
          }
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        pQVar3 = (roles->d).d.ptr;
      }
      pQVar2->view = this_00;
      if (local_78.size != 0) {
        itemChanged(this,pQVar2,(QList<int> *)&local_78);
      }
      QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
    }
    bVar1 = true;
  }
  else {
LAB_00535b6d:
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;

    QTableWidget *view = this->view();
    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->view = nullptr; // prohibits item from calling itemChanged()
        QList<int> rolesVec;
        for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it) {
            const int role = (it.key() == Qt::EditRole ? Qt::DisplayRole : it.key());
            if (itm->data(role) != it.value()) {
                itm->setData(role, it.value());
                rolesVec += role;
                if (role == Qt::DisplayRole)
                    rolesVec += Qt::EditRole;
            }
        }
        itm->view = view;
        if (!rolesVec.isEmpty())
            itemChanged(itm, rolesVec);
        return true;
    }

    if (!view)
        return false;

    itm = createItem();
    for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it)
        itm->setData(it.key(), it.value());
    view->setItem(index.row(), index.column(), itm);
    return true;
}